

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReductionTypeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  LayerCase LVar3;
  Tensor *this_00;
  string *__rhs;
  ReduceL1LayerParams *this_01;
  ReduceL2LayerParams *this_02;
  ReduceMaxLayerParams *this_03;
  ReduceMinLayerParams *this_04;
  ReduceSumLayerParams *this_05;
  ReduceProdLayerParams *this_06;
  ReduceMeanLayerParams *this_07;
  ReduceLogSumLayerParams *this_08;
  ReduceSumSquareLayerParams *this_09;
  ReduceLogSumExpLayerParams *this_10;
  RepeatedField<long> *pRVar4;
  const_iterator plVar5;
  long *axis_9;
  const_iterator __end3_9;
  const_iterator __begin3_9;
  RepeatedField<long> *__range3_9;
  long *axis_8;
  const_iterator __end3_8;
  const_iterator __begin3_8;
  RepeatedField<long> *__range3_8;
  long *axis_7;
  const_iterator __end3_7;
  const_iterator __begin3_7;
  RepeatedField<long> *__range3_7;
  long *axis_6;
  const_iterator __end3_6;
  const_iterator __begin3_6;
  RepeatedField<long> *__range3_6;
  long *axis_5;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  RepeatedField<long> *__range3_5;
  long *axis_4;
  const_iterator __end3_4;
  const_iterator __begin3_4;
  RepeatedField<long> *__range3_4;
  long *axis_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  RepeatedField<long> *__range3_3;
  long *axis_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  RepeatedField<long> *__range3_2;
  long *axis_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  RepeatedField<long> *__range3_1;
  long *axis;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedField<long> *__range3;
  undefined1 local_60 [8];
  string err;
  int rank;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    err.field_2._M_local_buf[0xf] = '\0';
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      err.field_2._M_local_buf[0xf] = '\x01';
    }
    if ((err.field_2._M_local_buf[0xf] & 1U) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (bVar1) {
      iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
      if (0 < iVar2) {
        this_00 = Specification::NeuralNetworkLayer::inputtensor(layer,0);
        err.field_2._8_4_ = Specification::Tensor::rank(this_00);
        __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range3,
                       "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &__range3,"\' layer.");
        std::__cxx11::string::~string((string *)&__range3);
        LVar3 = Specification::NeuralNetworkLayer::layer_case(layer);
        switch(LVar3) {
        case kReduceL1:
          this_01 = Specification::NeuralNetworkLayer::reducel1(layer);
          pRVar4 = Specification::ReduceL1LayerParams::axes(this_01);
          __end3 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3 != plVar5; __end3 = __end3 + 1) {
            if ((*__end3 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        default:
          break;
        case kReduceL2:
          this_02 = Specification::NeuralNetworkLayer::reducel2(layer);
          pRVar4 = Specification::ReduceL2LayerParams::axes(this_02);
          __end3_1 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_1 != plVar5; __end3_1 = __end3_1 + 1) {
            if ((*__end3_1 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_1)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        case kReduceMax:
          this_03 = Specification::NeuralNetworkLayer::reducemax(layer);
          pRVar4 = Specification::ReduceMaxLayerParams::axes(this_03);
          __end3_2 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_2 != plVar5; __end3_2 = __end3_2 + 1) {
            if ((*__end3_2 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_2)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        case kReduceMin:
          this_04 = Specification::NeuralNetworkLayer::reducemin(layer);
          pRVar4 = Specification::ReduceMinLayerParams::axes(this_04);
          __end3_3 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_3 != plVar5; __end3_3 = __end3_3 + 1) {
            if ((*__end3_3 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_3)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        case kReduceSum:
          this_05 = Specification::NeuralNetworkLayer::reducesum(layer);
          pRVar4 = Specification::ReduceSumLayerParams::axes(this_05);
          __end3_4 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_4 != plVar5; __end3_4 = __end3_4 + 1) {
            if ((*__end3_4 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_4)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        case kReduceProd:
          this_06 = Specification::NeuralNetworkLayer::reduceprod(layer);
          pRVar4 = Specification::ReduceProdLayerParams::axes(this_06);
          __end3_5 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_5 != plVar5; __end3_5 = __end3_5 + 1) {
            if ((*__end3_5 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_5)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        case kReduceMean:
          this_07 = Specification::NeuralNetworkLayer::reducemean(layer);
          pRVar4 = Specification::ReduceMeanLayerParams::axes(this_07);
          __end3_6 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_6 != plVar5; __end3_6 = __end3_6 + 1) {
            if ((*__end3_6 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_6)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        case kReduceLogSum:
          this_08 = Specification::NeuralNetworkLayer::reducelogsum(layer);
          pRVar4 = Specification::ReduceLogSumLayerParams::axes(this_08);
          __end3_7 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_7 != plVar5; __end3_7 = __end3_7 + 1) {
            if ((*__end3_7 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_7)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        case kReduceSumSquare:
          this_09 = Specification::NeuralNetworkLayer::reducesumsquare(layer);
          pRVar4 = Specification::ReduceSumSquareLayerParams::axes(this_09);
          __end3_8 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_8 != plVar5; __end3_8 = __end3_8 + 1) {
            if ((*__end3_8 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_8)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
          break;
        case kReduceLogSumExp:
          this_10 = Specification::NeuralNetworkLayer::reducelogsumexp(layer);
          pRVar4 = Specification::ReduceLogSumExpLayerParams::axes(this_10);
          __end3_9 = google::protobuf::RepeatedField<long>::begin(pRVar4);
          plVar5 = google::protobuf::RepeatedField<long>::end(pRVar4);
          for (; __end3_9 != plVar5; __end3_9 = __end3_9 + 1) {
            if ((*__end3_9 < (long)(int)-err.field_2._8_4_) ||
               ((long)(int)err.field_2._8_4_ <= *__end3_9)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
              bVar1 = true;
              goto LAB_004dc98e;
            }
          }
        }
        bVar1 = false;
LAB_004dc98e:
        std::__cxx11::string::~string((string *)local_60);
        if (bVar1) {
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReductionTypeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    // all given axes should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";

        switch (layer.layer_case()) {
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL1:
                for (const auto& axis : layer.reducel1().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL2:
                for (const auto& axis : layer.reducel2().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMax:
                for (const auto& axis : layer.reducemax().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMin:
                for (const auto& axis : layer.reducemin().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSum:
                for (const auto& axis : layer.reducesum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceProd:
                for (const auto& axis : layer.reduceprod().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMean:
                for (const auto& axis : layer.reducemean().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSum:
                for (const auto& axis : layer.reducelogsum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSumSquare:
                for (const auto& axis : layer.reducesumsquare().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSumExp:
                for (const auto& axis : layer.reducelogsumexp().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;

            default:
                break;
        }
    }
    return Result();
}